

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_integral_img_int(uint8_t *gray_image,integral_image *iimage)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  uint8_t *puVar22;
  float fVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  int iVar27;
  long lVar28;
  ushort uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  
  pfVar19 = iimage->data;
  lVar20 = (long)iimage->data_width;
  iVar1 = iimage->width;
  lVar21 = (long)iVar1;
  uVar2 = iimage->height;
  if (lVar21 != 0) {
    fVar23 = 0.0;
    lVar24 = 0;
    do {
      fVar23 = (float)((int)fVar23 + (uint)gray_image[lVar24]);
      pfVar19[lVar24] = fVar23;
      lVar24 = lVar24 + 1;
    } while (lVar21 != lVar24);
  }
  if (1 < uVar2) {
    puVar22 = gray_image + lVar21;
    lVar24 = 1;
    pfVar26 = pfVar19;
    do {
      if (iVar1 != 0) {
        iVar27 = 0;
        lVar28 = 0;
        do {
          iVar27 = iVar27 + (uint)puVar22[lVar28];
          pfVar26[lVar20 + lVar28] = (float)((int)pfVar26[lVar28] + iVar27);
          lVar28 = lVar28 + 1;
        } while (lVar28 != lVar21);
      }
      lVar24 = lVar24 + 1;
      puVar22 = puVar22 + lVar21;
      pfVar26 = pfVar26 + lVar20;
    } while (lVar24 != (int)uVar2);
  }
  if (uVar2 != 0) {
    auVar30 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar33 = vpbroadcastq_avx512f();
    lVar24 = 0;
    do {
      if (iVar1 != 0) {
        uVar25 = 0;
        do {
          auVar34 = vpbroadcastq_avx512f();
          auVar35 = vporq_avx512f(auVar34,auVar31);
          auVar34 = vporq_avx512f(auVar34,auVar32);
          uVar16 = vpcmpuq_avx512f(auVar34,auVar33,2);
          bVar17 = (byte)uVar16;
          uVar16 = vpcmpuq_avx512f(auVar35,auVar33,2);
          bVar18 = (byte)uVar16;
          uVar29 = CONCAT11(bVar18,bVar17);
          auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar19 + uVar25));
          auVar35._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar34._4_4_;
          auVar35._0_4_ = (uint)(bVar17 & 1) * auVar34._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar34._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar34._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar34._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar34._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar34._24_4_;
          auVar35._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar34._28_4_;
          auVar35._32_4_ = (uint)(bVar18 & 1) * auVar34._32_4_;
          auVar35._36_4_ = (uint)(bVar18 >> 1 & 1) * auVar34._36_4_;
          auVar35._40_4_ = (uint)(bVar18 >> 2 & 1) * auVar34._40_4_;
          auVar35._44_4_ = (uint)(bVar18 >> 3 & 1) * auVar34._44_4_;
          auVar35._48_4_ = (uint)(bVar18 >> 4 & 1) * auVar34._48_4_;
          auVar35._52_4_ = (uint)(bVar18 >> 5 & 1) * auVar34._52_4_;
          auVar35._56_4_ = (uint)(bVar18 >> 6 & 1) * auVar34._56_4_;
          auVar35._60_4_ = (uint)(bVar18 >> 7) * auVar34._60_4_;
          auVar34 = vcvtudq2ps_avx512f(auVar35);
          auVar34 = vmulps_avx512f(auVar34,auVar30);
          pfVar26 = pfVar19 + uVar25;
          bVar3 = (bool)((byte)(uVar29 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar29 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar29 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar29 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar29 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar29 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar29 >> 7) & 1);
          bVar10 = (bool)(bVar18 >> 1 & 1);
          bVar11 = (bool)(bVar18 >> 2 & 1);
          bVar12 = (bool)(bVar18 >> 3 & 1);
          bVar13 = (bool)(bVar18 >> 4 & 1);
          bVar14 = (bool)(bVar18 >> 5 & 1);
          bVar15 = (bool)(bVar18 >> 6 & 1);
          *pfVar26 = (float)((uint)(bVar17 & 1) * auVar34._0_4_ |
                            (uint)!(bool)(bVar17 & 1) * (int)*pfVar26);
          pfVar26[1] = (float)((uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * (int)pfVar26[1]);
          pfVar26[2] = (float)((uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * (int)pfVar26[2]);
          pfVar26[3] = (float)((uint)bVar5 * auVar34._12_4_ | (uint)!bVar5 * (int)pfVar26[3]);
          pfVar26[4] = (float)((uint)bVar6 * auVar34._16_4_ | (uint)!bVar6 * (int)pfVar26[4]);
          pfVar26[5] = (float)((uint)bVar7 * auVar34._20_4_ | (uint)!bVar7 * (int)pfVar26[5]);
          pfVar26[6] = (float)((uint)bVar8 * auVar34._24_4_ | (uint)!bVar8 * (int)pfVar26[6]);
          pfVar26[7] = (float)((uint)bVar9 * auVar34._28_4_ | (uint)!bVar9 * (int)pfVar26[7]);
          pfVar26[8] = (float)((uint)(bVar18 & 1) * auVar34._32_4_ |
                              (uint)!(bool)(bVar18 & 1) * (int)pfVar26[8]);
          pfVar26[9] = (float)((uint)bVar10 * auVar34._36_4_ | (uint)!bVar10 * (int)pfVar26[9]);
          pfVar26[10] = (float)((uint)bVar11 * auVar34._40_4_ | (uint)!bVar11 * (int)pfVar26[10]);
          pfVar26[0xb] = (float)((uint)bVar12 * auVar34._44_4_ | (uint)!bVar12 * (int)pfVar26[0xb]);
          pfVar26[0xc] = (float)((uint)bVar13 * auVar34._48_4_ | (uint)!bVar13 * (int)pfVar26[0xc]);
          pfVar26[0xd] = (float)((uint)bVar14 * auVar34._52_4_ | (uint)!bVar14 * (int)pfVar26[0xd]);
          pfVar26[0xe] = (float)((uint)bVar15 * auVar34._56_4_ | (uint)!bVar15 * (int)pfVar26[0xe]);
          pfVar26[0xf] = (float)((uint)(bVar18 >> 7) * auVar34._60_4_ |
                                (uint)!(bool)(bVar18 >> 7) * (int)pfVar26[0xf]);
          uVar25 = uVar25 + 0x10;
        } while ((lVar21 + 0xfU & 0xfffffffffffffff0) != uVar25);
      }
      lVar24 = lVar24 + 1;
      pfVar19 = pfVar19 + lVar20;
    } while (lVar24 != (int)uVar2);
  }
  return;
}

Assistant:

void compute_integral_img_int(uint8_t *gray_image, struct integral_image *iimage) {

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    uint32_t row_sum = 0;

    /* sum up the first row */
    for (size_t i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_idata[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (size_t j = 1; j < height; ++j) {
        row_sum = 0;
        for (size_t i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j - 1) * data_width + i];
        }
    }

    
    float *iimage_data = iimage->data;

    for (size_t j = 0; j < height; ++j) {
        for (size_t i = 0; i < width; ++i) {
            //iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
            //iimage_data[j * data_width + i] = ((float) iimage_idata[j * data_width + i]) / 255.0f;
        }
    }
    

}